

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlkem_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8399fe::MLKEMTest_PWCT_Test::~MLKEMTest_PWCT_Test(MLKEMTest_PWCT_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MLKEMTest, PWCT) {
  auto pub768 = std::make_unique<uint8_t[]>(BCM_MLKEM768_PUBLIC_KEY_BYTES);
  auto priv768 = std::make_unique<BCM_mlkem768_private_key>();
  ASSERT_EQ(
      BCM_mlkem768_generate_key_fips(pub768.get(), nullptr, priv768.get()),
      bcm_status::approved);

  auto pub1024 = std::make_unique<uint8_t[]>(BCM_MLKEM1024_PUBLIC_KEY_BYTES);
  auto priv1024 = std::make_unique<BCM_mlkem1024_private_key>();
  ASSERT_EQ(
      BCM_mlkem1024_generate_key_fips(pub1024.get(), nullptr, priv1024.get()),
      bcm_status::approved);
}